

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::set<signed_char,std::less<signed_char>,std::allocator<signed_char>>,void>
               (set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *container,
               ostream *os)

{
  bool bVar1;
  _Base_ptr p_Var2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  p_Var2 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(container->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    lVar3 = 0;
    do {
      if (lVar3 == 0) {
LAB_001d9f52:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        testing::internal::PrintTo((int)(char)p_Var2[1]._M_color,os);
        lVar3 = lVar3 + 1;
        bVar1 = true;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar3 != 0x20) goto LAB_001d9f52;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
    if (lVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }